

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O3

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,_1,_0,__1,_1> *workspace)

{
  undefined1 auVar1 [16];
  Matrix<double,__1,__1,_0,__1,__1> *pMVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double *local_c8;
  ulong local_c0;
  ulong local_b8;
  Matrix<double,__1,__1,_0,__1,__1> *local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  Matrix<double,__1,_1,_0,__1,_1> *local_88;
  double *local_80;
  Matrix<double,__1,__1,_0,__1,__1> *local_78;
  ulong local_70;
  EssentialVectorType local_68;
  
  lVar8 = *(long *)(*(long *)this + 8);
  if (lVar8 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  DenseStorage<double,_-1,_-1,_1,_0>::resize
            ((DenseStorage<double,__1,__1,_1,_0> *)workspace,lVar8,lVar8,1);
  auVar1 = _DAT_0012b620;
  lVar8 = *(long *)(this + 0x18);
  pdVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  uVar7 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  uVar5 = (*(undefined8 **)this)[1];
  local_88 = workspace;
  if (uVar7 == uVar5 && (double *)**(undefined8 **)this == pdVar3) {
    uVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
    ;
    if (((long)uVar5 < 0) || ((long)uVar7 < 0)) {
      __assert_fail("a_index <= m_matrix.cols() && -a_index <= m_matrix.rows()",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Diagonal.h"
                    ,0x4b,
                    "Eigen::Diagonal<Eigen::Matrix<double, -1, -1>>::Diagonal(MatrixType &, Index) [MatrixType = Eigen::Matrix<double, -1, -1>, Index = 0]"
                   );
    }
    if (uVar7 <= uVar5) {
      uVar5 = uVar7;
    }
    if (uVar5 != 0) {
      lVar9 = uVar5 - 1;
      auVar15._8_4_ = (int)lVar9;
      auVar15._0_8_ = lVar9;
      auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar10 = 0;
      auVar15 = auVar15 ^ _DAT_0012b620;
      auVar16 = _DAT_0012b610;
      do {
        auVar17 = auVar16 ^ auVar1;
        if ((bool)(~(auVar17._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar17._0_4_ ||
                    auVar15._4_4_ < auVar17._4_4_) & 1)) {
          *pdVar3 = 1.0;
        }
        if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
            auVar17._12_4_ <= auVar15._12_4_) {
          pdVar3[uVar7 + 1] = 1.0;
        }
        uVar10 = uVar10 + 2;
        lVar9 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 2;
        auVar16._8_8_ = lVar9 + 2;
        pdVar3 = pdVar3 + uVar7 * 2 + 2;
      } while ((uVar5 + 1 & 0xfffffffffffffffe) != uVar10);
    }
    local_c8 = (double *)0x0;
    local_68.
    super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>.
    m_data = (PointerType)dst;
    TriangularViewImpl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U,_Eigen::Dense>::setConstant
              ((TriangularViewImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U,_Eigen::Dense> *)
               &local_68,(Scalar *)&local_c8);
    local_90 = lVar8;
    local_78 = dst;
    if (0 < lVar8) {
      lVar12 = -lVar8;
      lVar9 = lVar8 * 8;
      uVar7 = lVar8 + 1;
      do {
        pMVar2 = local_78;
        lVar9 = lVar9 + -8;
        lVar8 = uVar7 - 2;
        lVar4 = *(long *)(*(long *)this + 8);
        lVar14 = *(long *)(this + 0x20);
        local_c0 = (lVar4 - lVar14) + lVar12 + 1;
        local_b8 = local_c0;
        if (this[0x10] ==
            (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
             )0x1) {
          pdVar3 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          lVar13 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          lVar11 = (lVar14 + lVar13) - lVar4;
          uVar5 = (((lVar14 + (local_78->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_cols) - lVar4) + uVar7) - 2;
          local_c8 = pdVar3 + uVar7 + lVar11 + uVar5 * lVar13 + -2;
          if (pdVar3 != (double *)0x0 && (long)local_c0 < 0) goto LAB_001210c3;
          local_a8 = (lVar11 + uVar7) - 2;
          local_b0 = local_78;
          local_a0 = uVar5;
          local_98 = lVar13;
          if (((long)(local_a8 | local_c0) < 0) || ((long)(uVar5 | local_c0) < 0))
          goto LAB_001210a4;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_68,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,lVar8);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_c8,&local_68,(Scalar *)(**(long **)(this + 8) + lVar9),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        else {
          pdVar3 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          lVar13 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          lVar11 = (lVar14 + lVar13) - lVar4;
          uVar5 = (((lVar14 + (local_78->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_cols) - lVar4) + uVar7) - 2;
          local_c8 = pdVar3 + uVar7 + lVar11 + uVar5 * lVar13 + -2;
          if (pdVar3 != (double *)0x0 && (long)local_c0 < 0) goto LAB_001210c3;
          local_a8 = (lVar11 + uVar7) - 2;
          local_b0 = local_78;
          local_a0 = uVar5;
          local_98 = lVar13;
          if (((long)(local_a8 | local_c0) < 0) || ((long)(uVar5 | local_c0) < 0))
          goto LAB_001210a4;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_68,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,lVar8);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_c8,&local_68,(Scalar *)(**(long **)(this + 8) + lVar9),
                     (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        pdVar3 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar4 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                .m_rows;
        if (lVar4 < 0 && pdVar3 != (double *)0x0) goto LAB_0012108d;
        uVar5 = uVar7 - 1;
        if ((pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols < (long)uVar5) goto LAB_00121021;
        lVar14 = *(long *)(*(long *)this + 8);
        uVar10 = lVar12 + lVar14;
        if ((pdVar3 != (double *)0x0) && ((long)uVar10 < 0)) goto LAB_00121076;
        if ((long)((uVar7 + (lVar4 - lVar14)) - 1 | uVar10) < 0) goto LAB_0012105f;
        if ((long)uVar10 < 0) goto LAB_00121040;
        pdVar3 = pdVar3 + lVar4 * lVar8 + uVar7 + (lVar4 - lVar14) + -1;
        uVar7 = uVar10;
        if ((((ulong)pdVar3 & 7) == 0) &&
           (uVar7 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1), uVar10 <= uVar7)) {
          uVar7 = uVar10;
        }
        local_70 = uVar5;
        if (uVar7 != 0) {
          memset(pdVar3,0,uVar7 * 8);
        }
        lVar8 = lVar12 + (lVar14 - uVar7);
        uVar5 = lVar8 - (lVar8 >> 0x3f) & 0xfffffffffffffffe;
        lVar4 = uVar5 + uVar7;
        if (1 < lVar8) {
          lVar13 = uVar7 + 2;
          if ((long)(uVar7 + 2) < lVar4) {
            lVar13 = lVar4;
          }
          local_80 = pdVar3;
          memset(pdVar3 + uVar7,0,(~uVar7 + lVar13 & 0xfffffffffffffffe) * 8 + 0x10);
          pdVar3 = local_80;
        }
        if (lVar4 < (long)uVar10) {
          memset(pdVar3 + (lVar8 / 2) * 2 + uVar7,0,(((lVar14 - uVar7) - uVar5) + lVar12) * 8);
        }
        lVar12 = lVar12 + 1;
        workspace = local_88;
        uVar7 = local_70;
      } while (1 < local_70);
    }
    lVar8 = *(long *)(*(long *)this + 8);
    if (local_90 < lVar8) {
      lVar12 = -1;
      lVar9 = 0;
      do {
        pdVar3 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        lVar4 = (local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
        if (lVar4 < 0 && pdVar3 != (double *)0x0) goto LAB_0012108d;
        if ((local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar9) {
LAB_00121021:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                        ,0x7a,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                       );
        }
        uVar7 = lVar8 + lVar12;
        if ((long)uVar7 < 0 && pdVar3 != (double *)0x0) goto LAB_00121076;
        if ((long)((lVar4 - lVar8) + lVar9 + 1U | uVar7) < 0) goto LAB_0012105f;
        if ((long)uVar7 < 0) {
LAB_00121040:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        pdVar3 = pdVar3 + lVar4 * lVar9 + (lVar4 - lVar8) + lVar9 + 1;
        uVar5 = uVar7;
        if ((((ulong)pdVar3 & 7) == 0) &&
           (uVar5 = (ulong)((uint)((ulong)pdVar3 >> 3) & 1), uVar7 <= uVar5)) {
          uVar5 = uVar7;
        }
        if (uVar5 != 0) {
          memset(pdVar3,0,uVar5 * 8);
        }
        lVar4 = uVar7 - uVar5;
        lVar14 = (lVar4 - (lVar4 >> 0x3f) & 0xfffffffffffffffeU) + uVar5;
        if (1 < lVar4) {
          lVar13 = uVar5 + 2;
          if ((long)(uVar5 + 2) < lVar14) {
            lVar13 = lVar14;
          }
          memset(pdVar3 + uVar5,0,(~uVar5 + lVar13 & 0xfffffffffffffffe) * 8 + 0x10);
        }
        if (lVar14 < (long)uVar7) {
          memset(pdVar3 + (lVar4 / 2) * 2 + uVar5,0,
                 (((lVar8 + lVar12) - uVar5) + (lVar4 / 2) * -2) * 8);
        }
        lVar9 = lVar9 + 1;
        lVar8 = *(long *)(*(long *)this + 8);
        lVar12 = lVar12 + -1;
      } while (lVar9 < lVar8 - local_90);
    }
  }
  else {
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst,uVar5,uVar5);
    if (0x30 < lVar8) {
      applyThisOnTheLeft<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (this,dst,workspace,true);
      return;
    }
    if (0 < lVar8) {
      uVar7 = lVar8 + 1;
      lVar9 = -lVar8;
      lVar8 = lVar8 * 8;
      do {
        lVar8 = lVar8 + -8;
        lVar9 = lVar9 + 1;
        lVar12 = *(long *)(*(long *)this + 8);
        lVar4 = *(long *)(this + 0x20);
        local_c0 = (lVar12 - lVar4) + lVar9;
        local_b8 = local_c0;
        if (this[0x10] ==
            (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
             )0x1) {
          pdVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_data;
          lVar14 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_rows;
          lVar13 = (lVar4 + lVar14) - lVar12;
          uVar5 = (((lVar4 + (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                             .m_storage.m_cols) - lVar12) + uVar7) - 2;
          local_c8 = pdVar3 + uVar7 + lVar13 + uVar5 * lVar14 + -2;
          if (pdVar3 != (double *)0x0 && (long)local_c0 < 0) goto LAB_001210c3;
          local_a8 = (uVar7 + lVar13) - 2;
          local_b0 = dst;
          local_a0 = uVar5;
          local_98 = lVar14;
          if (((long)(local_a8 | local_c0) < 0) || ((long)(uVar5 | local_c0) < 0))
          goto LAB_001210a4;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_68,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,uVar7 - 2);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_c8,&local_68,(Scalar *)(**(long **)(this + 8) + lVar8),
                     (local_88->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        else {
          pdVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_data;
          lVar14 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                   .m_rows;
          lVar13 = (lVar4 + lVar14) - lVar12;
          uVar5 = (((lVar4 + (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                             .m_storage.m_cols) - lVar12) + uVar7) - 2;
          local_c8 = pdVar3 + uVar7 + lVar13 + uVar5 * lVar14 + -2;
          if (pdVar3 != (double *)0x0 && (long)local_c0 < 0) goto LAB_001210c3;
          local_a8 = (uVar7 + lVar13) - 2;
          local_b0 = dst;
          local_a0 = uVar5;
          local_98 = lVar14;
          if (((long)(local_a8 | local_c0) < 0) || ((long)(uVar5 | local_c0) < 0))
          goto LAB_001210a4;
          HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::essentialVector(&local_68,
                            (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                             *)this,uVar7 - 2);
          MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
          applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                    ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                     &local_c8,&local_68,(Scalar *)(**(long **)(this + 8) + lVar8),
                     (local_88->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data);
        }
        uVar7 = uVar7 - 1;
      } while (1 < uVar7);
    }
  }
  return;
LAB_001210c3:
  pcVar6 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, Level = 0]"
  ;
  local_c0 = local_b8;
  goto LAB_001210d8;
LAB_001210a4:
  pcVar6 = 
  "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
  ;
  local_c0 = local_b8;
  goto LAB_001210b9;
LAB_0012108d:
  pcVar6 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
  ;
  goto LAB_001210d8;
LAB_0012105f:
  pcVar6 = 
  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_001210b9:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                ,0x93,pcVar6);
LAB_00121076:
  pcVar6 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, -1, 1>, Level = 0]"
  ;
LAB_001210d8:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                ,0xb2,pcVar6);
}

Assistant:

EIGEN_DEVICE_FUNC
    void evalTo(Dest& dst, Workspace& workspace) const
    {
      workspace.resize(rows());
      Index vecs = m_length;
      if(internal::is_same_dense(dst,m_vectors))
      {
        // in-place
        dst.diagonal().setOnes();
        dst.template triangularView<StrictlyUpper>().setZero();
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_reverse)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());

          // clear the off diagonal vector
          dst.col(k).tail(rows()-k-1).setZero();
        }
        // clear the remaining columns if needed
        for(Index k = 0; k<cols()-vecs ; ++k)
          dst.col(k).tail(rows()-k-1).setZero();
      }
      else if(m_length>BlockSize)
      {
        dst.setIdentity(rows(), rows());
        if(m_reverse)
          applyThisOnTheLeft(dst,workspace,true);
        else
          applyThisOnTheLeft(dst,workspace,true);
      }
      else
      {
        dst.setIdentity(rows(), rows());
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_reverse)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());
        }
      }
    }